

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fraInd.c
# Opt level: O1

void Fra_FramesAddMore(Aig_Man_t *p,int nFrames)

{
  int iVar1;
  int iVar2;
  int iVar3;
  void *pvVar4;
  uint uVar5;
  long lVar6;
  undefined8 *__ptr;
  Vec_Ptr_t *pVVar7;
  ulong uVar8;
  ulong uVar9;
  undefined8 *puVar10;
  Aig_Obj_t *p1;
  int iVar11;
  Aig_Obj_t *pAVar12;
  ulong uVar13;
  ulong uVar14;
  int iVar15;
  
  pVVar7 = p->vObjs;
  iVar11 = pVVar7->nSize;
  if (0 < iVar11) {
    lVar6 = 0;
    do {
      pvVar4 = pVVar7->pArray[lVar6];
      if (pvVar4 != (void *)0x0) {
        *(void **)((long)pvVar4 + 0x28) = pvVar4;
      }
      lVar6 = lVar6 + 1;
      pVVar7 = p->vObjs;
      iVar11 = pVVar7->nSize;
    } while (lVar6 < iVar11);
  }
  __ptr = (undefined8 *)malloc((long)p->nRegs << 3);
  if (0 < nFrames) {
    iVar15 = 0;
    do {
      uVar5 = p->nObjs[3] - p->nRegs;
      pVVar7 = p->vCos;
      if ((int)uVar5 < pVVar7->nSize) {
        uVar8 = (ulong)uVar5;
        do {
          if ((int)uVar5 < 0) goto LAB_005cee05;
          *(undefined8 *)((long)pVVar7->pArray[uVar8] + 0x28) = 0;
          uVar8 = uVar8 + 1;
          pVVar7 = p->vCos;
        } while ((int)uVar8 < pVVar7->nSize);
      }
      uVar5 = p->nObjs[2] - p->nRegs;
      pVVar7 = p->vCis;
      if ((int)uVar5 < pVVar7->nSize) {
        uVar8 = (ulong)uVar5;
        do {
          if ((int)uVar5 < 0) goto LAB_005cee05;
          *(undefined8 *)((long)pVVar7->pArray[uVar8] + 0x28) = 0;
          uVar8 = uVar8 + 1;
          pVVar7 = p->vCis;
        } while ((int)uVar8 < pVVar7->nSize);
      }
      iVar1 = p->nObjs[3];
      iVar2 = p->nRegs;
      uVar5 = iVar1 - iVar2;
      pVVar7 = p->vCos;
      iVar3 = pVVar7->nSize;
      if ((int)uVar5 < iVar3) {
        uVar8 = 0;
        do {
          if ((int)uVar5 < 0) goto LAB_005cee05;
          pvVar4 = pVVar7->pArray[uVar5 + uVar8];
          uVar9 = *(ulong *)((long)pvVar4 + 8);
          uVar14 = uVar9 & 0xfffffffffffffffe;
          uVar13 = *(ulong *)(uVar14 + 0x28);
          if (uVar13 == 0) {
            uVar13 = 0;
          }
          else {
            if (((ulong)pvVar4 & 1) != 0) goto LAB_005cee24;
            uVar13 = (uint)uVar9 & 1 ^ uVar13;
            if (uVar14 == 0) {
              uVar13 = 0;
            }
          }
          __ptr[uVar8] = uVar13;
          uVar8 = uVar8 + 1;
        } while ((uint)((iVar3 + iVar2) - iVar1) != uVar8);
      }
      uVar5 = p->nObjs[2] - iVar2;
      pVVar7 = p->vCis;
      if ((int)uVar5 < pVVar7->nSize) {
        uVar8 = (ulong)uVar5;
        puVar10 = __ptr;
        do {
          if ((int)uVar5 < 0) {
LAB_005cee05:
            __assert_fail("i >= 0 && i < p->nSize",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/misc/vec/vecPtr.h"
                          ,0x184,"void *Vec_PtrEntry(Vec_Ptr_t *, int)");
          }
          *(undefined8 *)((long)pVVar7->pArray[uVar8] + 0x28) = *puVar10;
          uVar8 = uVar8 + 1;
          pVVar7 = p->vCis;
          puVar10 = puVar10 + 1;
        } while ((int)uVar8 < pVVar7->nSize);
      }
      pVVar7 = p->vObjs;
      if (0 < pVVar7->nSize) {
        lVar6 = 0;
        do {
          pvVar4 = pVVar7->pArray[lVar6];
          if ((pvVar4 != (void *)0x0) && (0xfffffffd < (*(uint *)((long)pvVar4 + 0x18) & 7) - 7)) {
            if (iVar11 < lVar6) break;
            uVar9 = *(ulong *)((long)pvVar4 + 8) & 0xfffffffffffffffe;
            uVar8 = *(ulong *)(uVar9 + 0x28);
            if (uVar8 == 0) {
LAB_005cedb3:
              pAVar12 = (Aig_Obj_t *)0x0;
            }
            else {
              uVar14 = *(ulong *)((long)pvVar4 + 0x10) & 0xfffffffffffffffe;
              uVar13 = *(ulong *)(uVar14 + 0x28);
              if (uVar13 == 0) goto LAB_005cedb3;
              if (((ulong)pvVar4 & 1) != 0) {
LAB_005cee24:
                __assert_fail("!Aig_IsComplement(pObj)",
                              "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/aig/aig/aig.h"
                              ,0x138,"Aig_Obj_t *Aig_ObjChild0Copy(Aig_Obj_t *)");
              }
              pAVar12 = (Aig_Obj_t *)((uint)*(ulong *)((long)pvVar4 + 8) & 1 ^ uVar8);
              if (uVar9 == 0) {
                pAVar12 = (Aig_Obj_t *)0x0;
              }
              p1 = (Aig_Obj_t *)((uint)*(ulong *)((long)pvVar4 + 0x10) & 1 ^ uVar13);
              if (uVar14 == 0) {
                p1 = (Aig_Obj_t *)0x0;
              }
              pAVar12 = Aig_And(p,pAVar12,p1);
            }
            *(Aig_Obj_t **)((long)pvVar4 + 0x28) = pAVar12;
          }
          lVar6 = lVar6 + 1;
          pVVar7 = p->vObjs;
        } while (lVar6 < pVVar7->nSize);
      }
      iVar15 = iVar15 + 1;
    } while (iVar15 != nFrames);
  }
  if (__ptr == (undefined8 *)0x0) {
    return;
  }
  free(__ptr);
  return;
}

Assistant:

void Fra_FramesAddMore( Aig_Man_t * p, int nFrames )
{
    Aig_Obj_t * pObj, ** pLatches;
    int i, k, f, nNodesOld;
    // set copy pointer of each object to point to itself
    Aig_ManForEachObj( p, pObj, i )
        pObj->pData = pObj;
    // iterate and add objects
    nNodesOld = Aig_ManObjNumMax(p);
    pLatches = ABC_ALLOC( Aig_Obj_t *, Aig_ManRegNum(p) );
    for ( f = 0; f < nFrames; f++ )
    {
        // clean latch inputs and outputs
        Aig_ManForEachLiSeq( p, pObj, i )
            pObj->pData = NULL;
        Aig_ManForEachLoSeq( p, pObj, i )
            pObj->pData = NULL;
        // save the latch input values
        k = 0;
        Aig_ManForEachLiSeq( p, pObj, i )
        {
            if ( Aig_ObjFanin0(pObj)->pData )
                pLatches[k++] = Aig_ObjChild0Copy(pObj);
            else
                pLatches[k++] = NULL;
        }
        // insert them as the latch output values
        k = 0;
        Aig_ManForEachLoSeq( p, pObj, i )
            pObj->pData = pLatches[k++];
        // create the next time frame of nodes
        Aig_ManForEachNode( p, pObj, i )
        {
            if ( i > nNodesOld )
                break;
            if ( Aig_ObjFanin0(pObj)->pData && Aig_ObjFanin1(pObj)->pData )
                pObj->pData = Aig_And( p, Aig_ObjChild0Copy(pObj), Aig_ObjChild1Copy(pObj) );
            else
                pObj->pData = NULL;
        }
    }
    ABC_FREE( pLatches );
}